

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O3

void __thiscall
udpdiscovery::impl::PeerEnv::decreaseRefCountAndMaybeDestroySelfAndUnlock(PeerEnv *this)

{
  int iVar1;
  
  iVar1 = this->ref_count_;
  this->ref_count_ = iVar1 + -1;
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
  if (iVar1 < 2) {
    if (iVar1 != 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Strangly ref count is less than 0.",0x22);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
      std::ostream::put(-0x50);
      std::ostream::flush();
    }
    (*(this->super_PeerEnvInterface)._vptr_PeerEnvInterface[1])(this);
    return;
  }
  return;
}

Assistant:

void decreaseRefCountAndMaybeDestroySelfAndUnlock() {
    --ref_count_;
    int cur_ref_count = ref_count_;

    // This method is performed when the mutex is locked.
    lock_.Unlock();

    if (cur_ref_count <= 0) {
      if (cur_ref_count < 0) {
        // Shouldn't be there.
        std::cerr << "Strangly ref count is less than 0." << std::endl;
      }

      delete this;
    }
  }